

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

void apu_push_sample(gba_apu_t *apu)

{
  uint8_t uVar1;
  ulong uVar2;
  float fVar3;
  float sample;
  uint64_t size;
  gba_apu_t *apu_local;
  float fifo1;
  float fifo0;
  int8_t ssample_1;
  int8_t ssample;
  
  if ((apu->bigbuffer).write_index - (apu->bigbuffer).read_index < 0x1000) {
    fVar3 = (float)(int)(char)apu->fifo[0].sample + 127.0;
    uVar1 = apu->fifo[1].sample;
    uVar2 = (apu->bigbuffer).write_index;
    (apu->bigbuffer).write_index = uVar2 + 1;
    (apu->bigbuffer).buf[uVar2 & 0xfff] =
         ((fVar3 + fVar3) / 255.0 + -1.0 + (((float)(int)(char)uVar1 - -127.0) * 2.0) / 255.0 + -1.0
         ) / 2.0;
  }
  return;
}

Assistant:

void apu_push_sample(gba_apu_t* apu) {
    uint64_t size = apu->bigbuffer.write_index - apu->bigbuffer.read_index;
    if (size < AUDIO_BIGBUFFER_SIZE) {
        float sample = mix(apu);
        apu->bigbuffer.buf[(apu->bigbuffer.write_index++) % AUDIO_BIGBUFFER_SIZE] = sample;
    }
}